

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O2

void __thiscall crnlib::random::seed(random *this,uint32 i)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32 jsr;
  uint uVar4;
  
  uVar1 = i << 0x11 ^ i;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  uVar1 = uVar1 << 5 ^ uVar1;
  uVar1 = uVar1 << 0x11 ^ uVar1;
  uVar1 = uVar1 >> 0xd ^ uVar1;
  uVar1 = uVar1 << 5 ^ uVar1;
  uVar3 = uVar1 << 0x11 ^ uVar1;
  uVar1 = ~uVar1;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar3 = uVar3 >> 0xd ^ uVar3;
  uVar3 = uVar3 << 5 ^ uVar3;
  uVar2 = uVar3 << 0x11 ^ uVar3;
  uVar2 = uVar2 >> 0xd ^ uVar2;
  uVar2 = uVar2 << 5 ^ uVar2;
  uVar4 = uVar2 << 0x11 ^ uVar2;
  uVar4 = uVar4 >> 0xd ^ uVar4;
  seed(this,uVar1 * -0x59004c2b + 0xee31141 ^ uVar3,uVar1 * 0x6ab9d291 + 0x8508f494 ^ uVar2,
       uVar1 * -0x46f004e3 + (uVar4 << 5 ^ uVar4) + 0xf13e350b);
  return;
}

Assistant:

void random::seed(uint32 i) {
  uint32 jsr = i;
  SHR3;
  SHR3;
  uint32 jcong = utils::swap32(~jsr);
  CONG;
  CONG;
  uint32 i1 = SHR3 ^ CONG;
  uint32 i2 = SHR3 ^ CONG;
  uint32 i3 = SHR3 + CONG;
  seed(i1, i2, i3);
}